

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localenc.c
# Opt level: O2

int charset_from_localenc(char *name)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  __int32_t **pp_Var5;
  long lVar6;
  long local_40;
  
  iVar4 = charset_from_mimeenc(name);
  if ((iVar4 == 0) && (iVar4 = charset_from_xenc(name), iVar4 == 0)) {
    local_40 = 0;
    lVar6 = local_40;
    do {
      local_40 = lVar6;
      if (local_40 == 0x38) {
        return 0;
      }
      pcVar3 = localencs[local_40].name;
      lVar6 = 0;
      while( true ) {
        bVar1 = name[lVar6];
        bVar2 = pcVar3[lVar6];
        if (bVar1 == 0 && bVar2 == 0) goto LAB_00113c1b;
        pp_Var5 = __ctype_tolower_loc();
        if ((*pp_Var5)[bVar1] != (*pp_Var5)[bVar2]) break;
        lVar6 = lVar6 + 1;
      }
      lVar6 = local_40 + 1;
    } while (bVar2 != 0 || bVar1 != 0);
LAB_00113c1b:
    iVar4 = localencs[local_40].charset;
  }
  return iVar4;
}

Assistant:

int charset_from_localenc(const char *name)
{
    int i;

    if ( (i = charset_from_mimeenc(name)) != CS_NONE)
        return i;
    if ( (i = charset_from_xenc(name)) != CS_NONE)
        return i;

    for (i = 0; i < (int)lenof(localencs); i++) {
        const char *p, *q;
        p = name;
        q = localencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return localencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}